

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O0

int __thiscall
leveldb::InternalKeyComparator::Compare(InternalKeyComparator *this,Slice *akey,Slice *bkey)

{
  long *plVar1;
  char *ptr;
  uint64_t uVar2;
  uint64_t uVar3;
  long in_RDI;
  long in_FS_OFFSET;
  uint64_t bnum;
  uint64_t anum;
  int r;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  Slice *in_stack_ffffffffffffff98;
  int local_44;
  Slice local_28;
  Slice local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = *(long **)(in_RDI + 8);
  local_18 = ExtractUserKey(in_stack_ffffffffffffff98);
  local_28 = ExtractUserKey(in_stack_ffffffffffffff98);
  local_44 = (**(code **)(*plVar1 + 0x10))(plVar1,&local_18,&local_28);
  if (local_44 == 0) {
    ptr = Slice::data((Slice *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    Slice::size((Slice *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    uVar2 = DecodeFixed64(ptr);
    Slice::data((Slice *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    Slice::size((Slice *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    uVar3 = DecodeFixed64(ptr);
    if (uVar3 < uVar2) {
      local_44 = -1;
    }
    else if (uVar2 < uVar3) {
      local_44 = 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_44;
}

Assistant:

int InternalKeyComparator::Compare(const Slice& akey, const Slice& bkey) const {
  // Order by:
  //    increasing user key (according to user-supplied comparator)
  //    decreasing sequence number
  //    decreasing type (though sequence# should be enough to disambiguate)
  int r = user_comparator_->Compare(ExtractUserKey(akey), ExtractUserKey(bkey));
  if (r == 0) {
    const uint64_t anum = DecodeFixed64(akey.data() + akey.size() - 8);
    const uint64_t bnum = DecodeFixed64(bkey.data() + bkey.size() - 8);
    if (anum > bnum) {
      r = -1;
    } else if (anum < bnum) {
      r = +1;
    }
  }
  return r;
}